

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFImporter.cpp
# Opt level: O3

bool __thiscall Assimp::D3MF::XmlSerializer::ReadToEndElement(XmlSerializer *this,string *closeTag)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  Logger *this_00;
  long *plVar3;
  long *plVar4;
  byte unaff_BPL;
  long *local_70;
  size_t local_68;
  long local_60;
  long lStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  do {
    iVar2 = (*this->xmlReader->_vptr_IIrrXMLReader[2])();
    if ((char)iVar2 == '\0') {
      this_00 = DefaultLogger::get();
      std::operator+(&local_50,"unexpected EOF, expected closing <",closeTag);
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
      plVar4 = plVar3 + 2;
      if ((long *)*plVar3 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = plVar3[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*plVar3;
      }
      local_68 = plVar3[1];
      *plVar3 = (long)plVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      Logger::error(this_00,(char *)local_70);
      if (local_70 != &local_60) {
        operator_delete(local_70,local_60 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      unaff_BPL = 0;
      break;
    }
    iVar2 = (*this->xmlReader->_vptr_IIrrXMLReader[0xd])();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,(char *)CONCAT44(extraout_var,iVar2),(allocator<char> *)&local_50
              );
    iVar2 = (*this->xmlReader->_vptr_IIrrXMLReader[3])();
    if (iVar2 == 1) {
      unaff_BPL = 1;
LAB_00630293:
      bVar1 = false;
    }
    else {
      iVar2 = (*this->xmlReader->_vptr_IIrrXMLReader[3])();
      if (((iVar2 == 2) && (local_68 == closeTag->_M_string_length)) &&
         ((local_68 == 0 ||
          (iVar2 = bcmp(local_70,(closeTag->_M_dataplus)._M_p,local_68), iVar2 == 0)))) {
        unaff_BPL = 0;
        goto LAB_00630293;
      }
      bVar1 = true;
    }
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
  } while (bVar1);
  return (bool)(unaff_BPL & 1);
}

Assistant:

bool ReadToEndElement(const std::string& closeTag) {
        while(xmlReader->read()) {
            const std::string &nodeName( xmlReader->getNodeName() );
            if (xmlReader->getNodeType() == irr::io::EXN_ELEMENT) {
                return true;
            } else if (xmlReader->getNodeType() == irr::io::EXN_ELEMENT_END && nodeName == closeTag) {
                return false;
            }
        }
        ASSIMP_LOG_ERROR("unexpected EOF, expected closing <" + closeTag + "> tag");

        return false;
    }